

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

string * cfd::core::StringUtil::Join
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *str_list,string *separate_word)

{
  ulong uVar1;
  size_t sVar2;
  undefined1 local_1c0 [16];
  undefined1 *local_1b0;
  pointer local_1a8;
  stringstream ss;
  undefined1 local_190 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  local_1b0 = local_190;
  local_1a8 = (separate_word->_M_dataplus)._M_p;
  ::std::
  copy<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::ostream_iterator<std::__cxx11::string,char,std::char_traits<char>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (str_list->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
              *)(str_list->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish);
  ::std::__cxx11::stringbuf::str();
  uVar1 = __return_storage_ptr__->_M_string_length;
  sVar2 = strlen((separate_word->_M_dataplus)._M_p);
  if (sVar2 <= uVar1) {
    ::std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar1 - sVar2);
  }
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string StringUtil::Join(
    const std::vector<std::string> &str_list,
    const std::string &separate_word) {
  std::stringstream ss;
  std::copy(
      str_list.begin(), str_list.end(),
      std::ostream_iterator<std::string>(ss, separate_word.c_str()));
  std::string result = ss.str();

  if (result.size() < std::char_traits<char>::length(separate_word.c_str()))
    return result;

  result.erase(
      result.size() - std::char_traits<char>::length(separate_word.c_str()));
  return result;
}